

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  int *piVar1;
  FILE *__s;
  vec<unsigned_int> *pvVar2;
  uint *puVar3;
  uint uVar4;
  bool bVar5;
  CRef CVar6;
  Clause *this_00;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  int v;
  int i;
  long lVar11;
  
  this_00 = (Clause *)
            RegionAllocator<unsigned_int>::operator[]
                      (&(this->super_Solver).ca.super_RegionAllocator<unsigned_int>,cr);
  if ((this->super_Solver).trail_lim.sz != 0) {
    __assert_fail("decisionLevel() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                  ,0xc9,"bool Gluco::SimpSolver::strengthenClause(CRef, Lit)");
  }
  if (this->use_simplification != false) {
    Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
    if ((this->super_Solver).certifiedUNSAT == true) {
      for (lVar11 = 0; lVar11 < *(int *)&(this_00->header).field_0x4; lVar11 = lVar11 + 1) {
        uVar9 = *(uint *)(&this_00[1].header.field_0x0 + lVar11 * 4);
        if (uVar9 != l.x) {
          uVar4 = ~((int)uVar9 >> 1);
          if ((uVar9 & 1) == 0) {
            uVar4 = ((int)uVar9 >> 1) + 1;
          }
          fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar4);
        }
      }
      fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
    }
    if (*(int *)&(this_00->header).field_0x4 == 2) {
      removeClause(this,cr);
      Clause::strengthen(this_00,l);
    }
    else {
      if ((this->super_Solver).certifiedUNSAT == true) {
        fwrite("d ",2,1,(FILE *)(this->super_Solver).certifiedOutput);
        for (lVar11 = 0; __s = (FILE *)(this->super_Solver).certifiedOutput,
            lVar11 < *(int *)&(this_00->header).field_0x4; lVar11 = lVar11 + 1) {
          uVar9 = *(uint *)(&this_00[1].header.field_0x0 + lVar11 * 4);
          uVar8 = (int)uVar9 >> 1;
          uVar4 = ~uVar8;
          if ((uVar9 & 1) == 0) {
            uVar4 = uVar8 + 1;
          }
          fprintf(__s,"%i ",(ulong)uVar4);
        }
        fwrite("0\n",2,1,__s);
      }
      Solver::detachClause(&this->super_Solver,cr,true);
      Clause::strengthen(this_00,l);
      Solver::attachClause(&this->super_Solver,cr);
      v = l.x >> 1;
      pvVar2 = (this->occurs).occs.data;
      uVar9 = pvVar2[v].sz;
      puVar3 = pvVar2[v].data;
      uVar7 = 0;
      uVar10 = 0;
      if (0 < (int)uVar9) {
        uVar10 = (ulong)uVar9;
      }
      while( true ) {
        if (uVar10 == uVar7) {
          __assert_fail("j < ts.size()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alg.h"
                        ,0x2a,
                        "void Gluco::remove(V &, const T &) [V = Gluco::vec<unsigned int>, T = unsigned int]"
                       );
        }
        if (puVar3[uVar7] == cr) break;
        uVar7 = uVar7 + 1;
      }
      for (; (long)uVar7 < (long)(int)(uVar9 - 1); uVar7 = uVar7 + 1) {
        puVar3[uVar7] = puVar3[uVar7 + 1];
        uVar9 = pvVar2[v].sz;
      }
      vec<unsigned_int>::pop(pvVar2 + v);
      piVar1 = (this->n_occ).data + l.x;
      *piVar1 = *piVar1 + -1;
      updateElimHeap(this,v);
    }
    bVar5 = true;
    if (((undefined1  [12])this_00->header & (undefined1  [12])0xffffffff00000000) ==
        (undefined1  [12])0x100000000) {
      bVar5 = Solver::enqueue(&this->super_Solver,(Lit)*(int *)&this_00[1].header,0xffffffff);
      if (bVar5) {
        CVar6 = Solver::propagate(&this->super_Solver);
        bVar5 = CVar6 == 0xffffffff;
      }
      else {
        bVar5 = false;
      }
    }
    return bVar5;
  }
  __assert_fail("use_simplification",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                ,0xca,"bool Gluco::SimpSolver::strengthenClause(CRef, Lit)");
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
      for (int i = 0; i < c.size(); i++)
        if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
      fprintf(certifiedOutput, "0\n");
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
          fprintf(certifiedOutput, "d ");
          for (int i = 0; i < c.size(); i++)
            fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
          fprintf(certifiedOutput, "0\n");
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}